

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_field_gens.cc
# Opt level: O3

FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *
google::protobuf::compiler::java::MakeImmutableFieldGenerators
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
           *__return_storage_ptr__,Descriptor *descriptor,Context *context)

{
  byte bVar1;
  long lVar2;
  JavaType JVar3;
  int iVar4;
  int iVar5;
  Descriptor *pDVar6;
  ImmutableEnumFieldGenerator *this;
  Nonnull<const_char_*> failure_msg;
  bool bVar7;
  FieldDescriptor *descriptor_00;
  long lVar8;
  int builderBitIndex;
  int local_6c;
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false> local_60;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_58;
  Descriptor *local_50;
  long local_48;
  LogMessageFatal local_40;
  
  local_58 = __return_storage_ptr__;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (__return_storage_ptr__,descriptor);
  if (0 < descriptor->field_count_) {
    lVar8 = 0;
    local_48 = 0;
    local_6c = 0;
    builderBitIndex = 0;
    local_50 = descriptor;
    do {
      bVar1 = (&descriptor->fields_->field_0x1)[lVar8];
      bVar7 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 != bVar7) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      descriptor_00 = (FieldDescriptor *)(&descriptor->fields_->super_SymbolBase + lVar8);
      if ((bVar1 & 0x20) == 0) {
        bVar7 = IsRealOneof(descriptor_00);
        JVar3 = GetJavaType(descriptor_00);
        this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
        if (bVar7) {
          if (JVar3 == JAVATYPE_STRING) {
            ImmutableStringOneofFieldGenerator::ImmutableStringOneofFieldGenerator
                      ((ImmutableStringOneofFieldGenerator *)this,descriptor_00,local_6c,
                       builderBitIndex,context);
          }
          else if (JVar3 == JAVATYPE_ENUM) {
            ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
                      ((ImmutableEnumOneofFieldGenerator *)this,descriptor_00,local_6c,
                       builderBitIndex,context);
          }
          else if (JVar3 == JAVATYPE_MESSAGE) {
            ImmutableMessageOneofFieldGenerator::ImmutableMessageOneofFieldGenerator
                      ((ImmutableMessageOneofFieldGenerator *)this,descriptor_00,local_6c,
                       builderBitIndex,context);
          }
          else {
            ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator
                      ((ImmutablePrimitiveOneofFieldGenerator *)this,descriptor_00,local_6c,
                       builderBitIndex,context);
          }
        }
        else if (JVar3 == JAVATYPE_STRING) {
          ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
                    ((ImmutableStringFieldGenerator *)this,descriptor_00,local_6c,builderBitIndex,
                     context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
                    (this,descriptor_00,local_6c,builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
                    ((ImmutableMessageFieldGenerator *)this,descriptor_00,local_6c,builderBitIndex,
                     context);
        }
        else {
          ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
                    ((ImmutablePrimitiveFieldGenerator *)this,descriptor_00,local_6c,builderBitIndex
                     ,context);
        }
      }
      else {
        JVar3 = GetJavaType(descriptor_00);
        if (JVar3 == JAVATYPE_STRING) {
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          RepeatedImmutableStringFieldGenerator::RepeatedImmutableStringFieldGenerator
                    ((RepeatedImmutableStringFieldGenerator *)this,descriptor_00,local_6c,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          RepeatedImmutableEnumFieldGenerator::RepeatedImmutableEnumFieldGenerator
                    ((RepeatedImmutableEnumFieldGenerator *)this,descriptor_00,local_6c,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          pDVar6 = FieldDescriptor::message_type(descriptor_00);
          bVar7 = (pDVar6->options_->field_0)._impl_.map_entry_;
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          if (bVar7 == false) {
            RepeatedImmutableMessageFieldGenerator::RepeatedImmutableMessageFieldGenerator
                      ((RepeatedImmutableMessageFieldGenerator *)this,descriptor_00,local_6c,
                       builderBitIndex,context);
          }
          else {
            ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
                      ((ImmutableMapFieldGenerator *)this,descriptor_00,local_6c,builderBitIndex,
                       context);
          }
        }
        else {
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          RepeatedImmutablePrimitiveFieldGenerator::RepeatedImmutablePrimitiveFieldGenerator
                    ((RepeatedImmutablePrimitiveFieldGenerator *)this,descriptor_00,local_6c,
                     builderBitIndex,context);
        }
      }
      iVar4 = (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[5])
                        (this);
      iVar5 = (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[6])
                        (this);
      local_60._M_head_impl = &this->super_ImmutableFieldGenerator;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
                (local_58,descriptor_00,
                 (unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                  *)&local_60);
      lVar2 = local_48;
      descriptor = local_50;
      if ((ImmutableEnumFieldGenerator *)local_60._M_head_impl != (ImmutableEnumFieldGenerator *)0x0
         ) {
        (*((FieldGenerator *)&((local_60._M_head_impl)->super_FieldGenerator)._vptr_FieldGenerator)
          ->_vptr_FieldGenerator[1])();
      }
      local_6c = local_6c + iVar4;
      builderBitIndex = builderBitIndex + iVar5;
      local_60._M_head_impl = (ImmutableFieldGenerator *)0x0;
      local_48 = lVar2 + 1;
      lVar8 = lVar8 + 0x58;
    } while (local_48 < descriptor->field_count_);
  }
  return local_58;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator> MakeImmutableFieldGenerators(
    const Descriptor* descriptor, Context* context) {
  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  FieldGeneratorMap<ImmutableFieldGenerator> ret(descriptor);
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    auto generator = MakeImmutableGenerator(field, messageBitIndex,
                                            builderBitIndex, context);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
    ret.Add(field, std::move(generator));
  }
  return ret;
}